

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O3

void __thiscall
irr::video::CImage::CImage
          (CImage *this,ECOLOR_FORMAT format,dimension2d<unsigned_int> *size,void *data,
          bool ownForeignMemory,bool deleteMemory)

{
  uint uVar1;
  u32 uVar2;
  u8 *__dest;
  undefined3 in_register_00000081;
  uint uVar3;
  
  *(undefined8 *)&(this->super_IImage).field_0x40 = 0;
  *(undefined4 *)&(this->super_IImage).field_0x48 = 1;
  (this->super_IImage)._vptr_IImage = (_func_int **)0x269028;
  *(undefined8 *)&(this->super_IImage).field_0x38 = 0x2690a0;
  (this->super_IImage).Format = format;
  (this->super_IImage).Size = *size;
  (this->super_IImage).Data = (u8 *)0x0;
  (this->super_IImage).MipMapsData = (u8 *)0x0;
  (this->super_IImage).BytesPerPixel = 0;
  (this->super_IImage).Pitch = 0;
  (this->super_IImage).DeleteMemory = deleteMemory;
  (this->super_IImage).DeleteMipMapsMemory = false;
  uVar2 = IImage::getBitsPerPixelFromFormat(format);
  (this->super_IImage).BytesPerPixel = uVar2 >> 3;
  uVar3 = (this->super_IImage).Size.Width;
  (this->super_IImage).Pitch = (uVar2 >> 3) * uVar3;
  (this->super_IImage)._vptr_IImage = (_func_int **)0x268f68;
  *(undefined8 *)&(this->super_IImage).field_0x38 = 0x268fe0;
  if (CONCAT31(in_register_00000081,ownForeignMemory) == 0) {
    uVar1 = (this->super_IImage).Size.Height;
    uVar2 = IImage::getBitsPerPixelFromFormat((this->super_IImage).Format);
    uVar3 = uVar3 * uVar1 * (uVar2 >> 3);
    __dest = (u8 *)operator_new__((ulong)(uVar3 + 0xf & 0xfffffff0));
    (this->super_IImage).Data = __dest;
    memcpy(__dest,data,(ulong)uVar3);
    (this->super_IImage).DeleteMemory = true;
  }
  else {
    (this->super_IImage).Data = (u8 *)data;
  }
  return;
}

Assistant:

CImage::CImage(ECOLOR_FORMAT format, const core::dimension2d<u32> &size, void *data,
		bool ownForeignMemory, bool deleteMemory) :
		IImage(format, size, deleteMemory)
{
	if (ownForeignMemory) {
		Data = (u8 *)data;
	} else {
		const u32 dataSize = getDataSizeFromFormat(Format, Size.Width, Size.Height);
		const u32 allocSize = align_next(dataSize, 16);

		// allocate as u32 to ensure enough alignment when casted
		Data = reinterpret_cast<u8 *>(new u32[allocSize / 4]);
		memcpy(Data, data, dataSize);
		DeleteMemory = true;
	}
}